

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O1

int AF_A_SerpentCheckForAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  FState *newstate;
  VMValue *pVVar9;
  FName *label;
  char *__assertion;
  bool bVar10;
  FName FStack_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  label = &FStack_38;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c1018;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar6 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (this->super_DThinker).super_DObject.Class;
      bVar10 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar6 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar8 == pPVar4 || bVar10);
      if (pPVar8 != pPVar4 && !bVar10) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c1018;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c0fed;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar9,uVar6,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar10 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar10) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar10 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c1018;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar3 = (this->target).field_0.p;
      if (pAVar3 == (AActor *)0x0) {
        return 0;
      }
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if ((this->MissileState == (FState *)0x0) ||
           (bVar10 = AActor::CheckMeleeRange(this), bVar10)) {
          bVar10 = P_CheckMeleeRange2(this);
          if (bVar10) {
            iVar5 = FName::NameManager::FindName(&FName::NameData,"Walk",false);
            label = &local_30;
          }
          else {
            bVar10 = AActor::CheckMeleeRange(this);
            if (!bVar10) {
              return 0;
            }
            uVar6 = FRandom::GenRand32(&pr_serpentattack);
            if ((uVar6 & 0xe0) == 0) {
              iVar5 = FName::NameManager::FindName(&FName::NameData,"Walk",false);
              label = &local_34;
            }
            else {
              iVar5 = FName::NameManager::FindName(&FName::NameData,"Attack",false);
            }
          }
        }
        else {
          iVar5 = FName::NameManager::FindName(&FName::NameData,"Attack",false);
          label = &local_2c;
        }
        label->Index = iVar5;
        newstate = AActor::FindState(this,label);
        AActor::SetState(this,newstate,false);
        return 0;
      }
      (this->target).field_0.p = (AActor *)0x0;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c0fed:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c1018:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0x82,
                "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentCheckForAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		if (!self->CheckMeleeRange ())
		{
			self->SetState (self->FindState ("Attack"));
			return 0;
		}
	}
	if (P_CheckMeleeRange2 (self))
	{
		self->SetState (self->FindState ("Walk"));
	}
	else if (self->CheckMeleeRange ())
	{
		if (pr_serpentattack() < 32)
		{
			self->SetState (self->FindState ("Walk"));
		}
		else
		{
			self->SetState (self->FindState ("Attack"));
		}
	}
	return 0;
}